

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Mat.cpp
# Opt level: O2

float * __thiscall Mat::Getf(Mat *this)

{
  double *pdVar1;
  float *pfVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  
  uVar3 = (long)this->n_cols_ * (long)this->n_rows_;
  uVar5 = 0;
  uVar4 = 0xffffffffffffffff;
  if (-1 < (int)uVar3) {
    uVar4 = uVar3 * 4;
  }
  uVar6 = 0;
  if (0 < (int)uVar3) {
    uVar6 = uVar3 & 0xffffffff;
  }
  pfVar2 = (float *)operator_new__(uVar4);
  pdVar1 = this->v_;
  for (; uVar6 != uVar5; uVar5 = uVar5 + 1) {
    pfVar2[uVar5] = (float)pdVar1[uVar5];
  }
  return pfVar2;
}

Assistant:

float* Mat::Getf() {
	float * fdata;
	int size = n_rows_*n_cols_;
	fdata = new float[size];
	for(int i = 0; i < size; i++) 
		fdata[i] = (float) v_[i];
	return fdata;
}